

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
FIX::HttpServer::onConnect(HttpServer *this,SocketServer *server,socket_handle a,socket_handle s)

{
  bool bVar1;
  ulong uVar2;
  SocketMonitor *this_00;
  undefined4 in_register_0000000c;
  undefined4 extraout_EDX;
  undefined4 uVar3;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 uVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined1 local_20c8 [8];
  HttpConnection connection;
  socket_handle s_local;
  socket_handle a_local;
  SocketServer *server_local;
  HttpServer *this_local;
  
  connection.m_fds.fds_bits[0xf]._0_4_ = s;
  connection.m_fds.fds_bits[0xf]._4_4_ = a;
  bVar1 = socket_isValid(s);
  if (bVar1) {
    uVar5 = (ulong)(uint)connection.m_fds.fds_bits[0xf];
    HttpConnection::HttpConnection
              ((HttpConnection *)local_20c8,(uint)connection.m_fds.fds_bits[0xf]);
    uVar3 = extraout_EDX;
    uVar4 = extraout_var;
    do {
      uVar2 = HttpConnection::read
                        ((HttpConnection *)local_20c8,(int)uVar5,(void *)CONCAT44(uVar4,uVar3),
                         CONCAT44(in_register_0000000c,s));
      uVar3 = extraout_EDX_00;
      uVar4 = extraout_var_00;
    } while ((uVar2 & 1) != 0);
    this_00 = SocketServer::getMonitor(this->m_pServer);
    SocketMonitor::drop(this_00,(uint)connection.m_fds.fds_bits[0xf]);
    HttpConnection::~HttpConnection((HttpConnection *)local_20c8);
  }
  return;
}

Assistant:

void HttpServer::onConnect( SocketServer& server, socket_handle a, socket_handle s )
{
  if ( !socket_isValid( s ) ) return;
  HttpConnection connection( s );
  while( connection.read() ) {}
  m_pServer->getMonitor().drop( s );
}